

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O1

Type * __thiscall
spvtools::opt::analysis::TypeManager::RebuildType(TypeManager *this,uint32_t type_id,Type *type)

{
  bool array;
  bool multisample;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t use;
  Dim dimen;
  ImageFormat f;
  StorageClass sc;
  undefined8 uVar3;
  undefined8 *puVar4;
  Type *type_00;
  long lVar5;
  pointer pvVar6;
  pointer ppTVar7;
  int iVar8;
  Type *pTVar9;
  undefined4 extraout_var;
  const_iterator cVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  uVar11;
  long lVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Struct *this_00;
  _Rb_tree_node_base *p_Var13;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  __uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
  _Var14;
  undefined4 extraout_var_11;
  uint32_t uVar15;
  _Head_base<0UL,_spvtools::opt::analysis::Type_*,_false> _Var16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec;
  undefined8 *puVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec_1;
  pointer __x_00;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar18;
  AccessQualifier qualifier;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  rebuilt_ty;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  subtypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> copy;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x207,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
  rebuilt_ty._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
        )(__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )0x0;
  pTVar9 = GetType(this,type_id);
  if (pTVar9 != (Type *)0x0) goto LAB_001aa246;
  switch(type->kind_) {
  case kVoid:
  case kBool:
  case kInteger:
  case kFloat:
  case kSampler:
  case kOpaque:
  case kEvent:
  case kDeviceEvent:
  case kReserveId:
  case kQueue:
  case kPipe:
  case kPipeStorage:
  case kNamedBarrier:
  case kAccelerationStructureNV:
  case kRayQueryKHR:
  case kHitObjectNV:
    Type::Clone((Type *)&param_types);
    ppTVar7 = param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = rebuilt_ty;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )ppTVar7;
    if ((__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )uVar11._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )0x0) {
      (**(code **)(*(long *)uVar11._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                            _M_head_impl + 8))();
    }
    if (param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((*param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)();
    }
    goto LAB_001aa229;
  case kVector:
    iVar8 = (*type->_vptr_Type[0xe])(type);
    pTVar9 = *(Type **)(CONCAT44(extraout_var_00,iVar8) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    uVar15 = *(uint32_t *)(CONCAT44(extraout_var_00,iVar8) + 0x30);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x38);
    Vector::Vector((Vector *)
                   _Var14.
                   super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,
                   pTVar9,uVar15);
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    break;
  case kMatrix:
    iVar8 = (*type->_vptr_Type[0x10])(type);
    pTVar9 = *(Type **)(CONCAT44(extraout_var_03,iVar8) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    uVar15 = *(uint32_t *)(CONCAT44(extraout_var_03,iVar8) + 0x30);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x38);
    Matrix::Matrix((Matrix *)
                   _Var14.
                   super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,
                   pTVar9,uVar15);
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    break;
  case kImage:
    iVar8 = (*type->_vptr_Type[0x12])(type);
    lVar12 = CONCAT44(extraout_var_06,iVar8);
    pTVar9 = *(Type **)(lVar12 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    dimen = *(Dim *)(lVar12 + 0x30);
    uVar15 = *(uint32_t *)(lVar12 + 0x34);
    array = *(bool *)(lVar12 + 0x38);
    multisample = *(bool *)(lVar12 + 0x39);
    uVar1 = *(uint32_t *)(lVar12 + 0x40);
    f = *(ImageFormat *)(lVar12 + 0x44);
    qualifier = 0x1aa0b6;
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x48);
    Image::Image((Image *)_Var14.
                          super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                          _M_head_impl,pTVar9,dimen,uVar15,array,multisample,uVar1,f,qualifier);
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    goto LAB_001aa1c9;
  case kSampledImage:
    iVar8 = (*type->_vptr_Type[0x16])(type);
    pTVar9 = *(Type **)(CONCAT44(extraout_var_08,iVar8) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x30);
    *(undefined8 *)
     ((long)_Var14.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 8) = 0;
    *(undefined8 *)
     ((long)_Var14.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined8 *)
     ((long)_Var14.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined4 *)
     ((long)_Var14.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x20) = 8;
    *(undefined ***)
     _Var14.
     super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
     ._M_t.
     super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
     .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         &PTR__Type_003edbc0;
    *(Type **)((long)_Var14.
                     super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl +
              0x28) = pTVar9;
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    break;
  case kArray:
    iVar8 = (*type->_vptr_Type[0x18])(type);
    pTVar9 = *(Type **)(CONCAT44(extraout_var_04,iVar8) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x50);
    Array::Array((Array *)_Var14.
                          super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                          _M_head_impl,pTVar9,(LengthInfo *)(CONCAT44(extraout_var_04,iVar8) + 0x30)
                );
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    break;
  case kRuntimeArray:
    iVar8 = (*type->_vptr_Type[0x1a])(type);
    pTVar9 = *(Type **)(CONCAT44(extraout_var_05,iVar8) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x30);
    RuntimeArray::RuntimeArray
              ((RuntimeArray *)
               _Var14.
               super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,pTVar9);
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    break;
  case kStruct:
    iVar8 = (*type->_vptr_Type[0x1c])(type);
    lVar12 = CONCAT44(extraout_var_07,iVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve(&subtypes,*(long *)(lVar12 + 0x30) - *(long *)(lVar12 + 0x28) >> 3);
    puVar17 = *(undefined8 **)(lVar12 + 0x28);
    puVar4 = *(undefined8 **)(lVar12 + 0x30);
    if (puVar17 != puVar4) {
      do {
        pTVar9 = (Type *)*puVar17;
        param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
        cVar10 = std::
                 _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
        if (cVar10.
            super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = *(uint32_t *)
                    ((long)cVar10.
                           super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                           ._M_cur + 0x10);
        }
        param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar15,pTVar9);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&subtypes,(Type **)&param_types);
        puVar17 = puVar17 + 1;
      } while (puVar17 != puVar4);
    }
    uVar11._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )operator_new(0x70);
    Struct::Struct((Struct *)
                   uVar11._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,
                   &subtypes);
    if ((__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )rebuilt_ty._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )0x0) {
      lVar5 = *(long *)rebuilt_ty._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      rebuilt_ty._M_t.
      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
           uVar11._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      (**(code **)(lVar5 + 8))();
      uVar11._M_t.
      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
           rebuilt_ty._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    }
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         uVar11._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    this_00 = (Struct *)
              (**(code **)(*(long *)rebuilt_ty._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                                    _M_head_impl + 0xd8))();
    p_Var13 = *(_Rb_tree_node_base **)(lVar12 + 0x58);
    if (p_Var13 != (_Rb_tree_node_base *)(lVar12 + 0x48)) {
      do {
        param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(param_types.
                               super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,p_Var13[1]._M_color);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&param_types.
                     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                 (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&p_Var13[1]._M_parent);
        ppTVar7 = param_types.
                  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (param_types.
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            param_types.
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          uVar15 = (uint32_t)
                   param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                param_types.
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          do {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&copy,__x);
            Struct::AddMemberDecoration(this_00,uVar15,&copy);
            if (copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)copy.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)copy.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            __x = __x + 1;
          } while (__x != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppTVar7);
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&param_types.
                      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != (_Rb_tree_node_base *)(lVar12 + 0x48));
    }
    if (subtypes.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(subtypes.
                      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)subtypes.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)subtypes.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_001aa1d9;
  case kPointer:
    iVar8 = (*type->_vptr_Type[0x20])(type);
    pTVar9 = *(Type **)(CONCAT44(extraout_var_09,iVar8) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    sc = *(StorageClass *)(CONCAT44(extraout_var_09,iVar8) + 0x30);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x38);
    Pointer::Pointer((Pointer *)
                     _Var14.
                     super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,
                     pTVar9,sc);
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    break;
  case kFunction:
    iVar8 = (*type->_vptr_Type[0x22])(type);
    lVar12 = CONCAT44(extraout_var_02,iVar8);
    pTVar9 = *(Type **)(lVar12 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve(&param_types,*(long *)(lVar12 + 0x38) - *(long *)(lVar12 + 0x30) >> 3);
    puVar17 = *(undefined8 **)(lVar12 + 0x30);
    puVar4 = *(undefined8 **)(lVar12 + 0x38);
    if (puVar17 != puVar4) {
      do {
        type_00 = (Type *)*puVar17;
        subtypes.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)type_00;
        cVar10 = std::
                 _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->type_to_id_)._M_h,(key_type *)&subtypes);
        if (cVar10.
            super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = *(uint32_t *)
                    ((long)cVar10.
                           super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                           ._M_cur + 0x10);
        }
        subtypes.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar15,type_00);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&param_types,(Type **)&subtypes);
        puVar17 = puVar17 + 1;
      } while (puVar17 != puVar4);
    }
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&subtypes);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    uVar11._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )operator_new(0x48);
    Function::Function((Function *)
                       uVar11._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,
                       pTVar9,&param_types);
    if ((__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )rebuilt_ty._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )0x0) {
      lVar12 = *(long *)rebuilt_ty._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      rebuilt_ty._M_t.
      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
           uVar11._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      (**(code **)(lVar12 + 8))();
      uVar11._M_t.
      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
           rebuilt_ty._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    }
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         uVar11._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    if (param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(param_types.
                      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)param_types.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)param_types.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_001aa1d9;
  case kForwardPointer:
    iVar8 = (*type->_vptr_Type[0x2e])(type);
    uVar3 = *(undefined8 *)(CONCAT44(extraout_var_01,iVar8) + 0x24);
    uVar11._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )operator_new(0x38);
    *(undefined8 *)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 8) = 0;
    *(undefined8 *)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined8 *)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined4 *)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x20) =
         0x14;
    *(undefined ***)
     uVar11._M_t.
     super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
     ._M_t.
     super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
     .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         &PTR__Type_003ee220;
    *(undefined8 *)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x24) =
         uVar3;
    *(undefined8 *)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl + 0x30) = 0;
    if ((__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )rebuilt_ty._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         )0x0) {
      lVar12 = *(long *)rebuilt_ty._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      rebuilt_ty._M_t.
      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
           uVar11._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      (**(code **)(lVar12 + 8))();
      uVar11._M_t.
      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
           rebuilt_ty._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    }
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         uVar11._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    pTVar9 = *(Type **)(CONCAT44(extraout_var_01,iVar8) + 0x30);
    if (pTVar9 != (Type *)0x0) {
      lVar12 = (**(code **)(*(long *)rebuilt_ty._M_t.
                                     super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                     .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                                     _M_head_impl + 0x168))();
      param_types.
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
      cVar10 = std::
               _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
      if (cVar10.
          super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar15 = 0;
      }
      else {
        uVar15 = *(uint32_t *)
                  ((long)cVar10.
                         super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                         ._M_cur + 0x10);
      }
      pTVar9 = RebuildType(this,uVar15,pTVar9);
      iVar8 = (*pTVar9->_vptr_Type[0x1f])(pTVar9);
      *(ulong *)(lVar12 + 0x30) = CONCAT44(extraout_var_11,iVar8);
    }
    goto LAB_001aa1d9;
  case kCooperativeMatrixNV:
    iVar8 = (*type->_vptr_Type[0x36])(type);
    lVar12 = CONCAT44(extraout_var_10,iVar8);
    pTVar9 = *(Type **)(lVar12 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    uVar15 = *(uint32_t *)(lVar12 + 0x30);
    uVar1 = *(uint32_t *)(lVar12 + 0x34);
    uVar2 = *(uint32_t *)(lVar12 + 0x38);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x40);
    CooperativeMatrixNV::CooperativeMatrixNV
              ((CooperativeMatrixNV *)
               _Var14.
               super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,pTVar9,
               uVar15,uVar1,uVar2);
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
    goto LAB_001aa1c9;
  case kCooperativeMatrixKHR:
    iVar8 = (*type->_vptr_Type[0x38])(type);
    lVar12 = CONCAT44(extraout_var,iVar8);
    pTVar9 = *(Type **)(lVar12 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar9;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar9 = RebuildType(this,uVar15,pTVar9);
    uVar15 = *(uint32_t *)(lVar12 + 0x30);
    uVar1 = *(uint32_t *)(lVar12 + 0x34);
    uVar2 = *(uint32_t *)(lVar12 + 0x38);
    use = *(uint32_t *)(lVar12 + 0x3c);
    _Var14.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
          )operator_new(0x40);
    CooperativeMatrixKHR::CooperativeMatrixKHR
              ((CooperativeMatrixKHR *)
               _Var14.
               super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,pTVar9,
               uVar15,uVar1,uVar2,use);
    _Var16._M_head_impl = (Type *)rebuilt_ty;
    rebuilt_ty._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )_Var14.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
LAB_001aa1c9:
    if ((_Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>)_Var16._M_head_impl ==
        (_Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>)0x0) goto LAB_001aa1d9;
    goto LAB_001aa1d3;
  default:
    __assert_fail("false && \"Unhandled type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x29f,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
  if ((_Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>)_Var16._M_head_impl !=
      (_Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>)0x0) {
LAB_001aa1d3:
    (**(code **)(*(long *)_Var16._M_head_impl + 8))();
  }
LAB_001aa1d9:
  __x_00 = (type->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (type->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x_00 != pvVar6) {
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&param_types,__x_00);
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)((long)rebuilt_ty._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                           _M_head_impl + 8),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&param_types);
      if (param_types.
          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(param_types.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)param_types.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)param_types.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      __x_00 = __x_00 + 1;
    } while (__x_00 != pvVar6);
  }
LAB_001aa229:
  param_types.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&this->type_pool_;
  pVar18 = std::
           _Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
           ::
           _M_insert<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,true>>>>
                     ((_Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)param_types.
                         super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,&rebuilt_ty);
  pTVar9 = *(Type **)((long)pVar18.first.
                            super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                     + 8);
LAB_001aa246:
  if ((__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
       )rebuilt_ty._M_t.
        super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
        .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
       )0x0) {
    (**(code **)(*(long *)rebuilt_ty._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                          _M_head_impl + 8))();
  }
  return pTVar9;
}

Assistant:

Type* TypeManager::RebuildType(uint32_t type_id, const Type& type) {
  assert(type_id != 0);

  // The comparison and hash on the type pool will avoid inserting the rebuilt
  // type if an equivalent type already exists. The rebuilt type will be deleted
  // when it goes out of scope at the end of the function in that case. Repeated
  // insertions of the same Type will, at most, keep one corresponding object in
  // the type pool.
  std::unique_ptr<Type> rebuilt_ty;

  // If |type_id| is already present in the type pool, return the existing type.
  // This saves extra work in the type builder and prevents running into
  // circular issues (https://github.com/KhronosGroup/SPIRV-Tools/issues/5623).
  Type* pool_ty = GetType(type_id);
  if (pool_ty != nullptr) {
    return pool_ty;
  }

  switch (type.kind()) {
#define DefineNoSubtypeCase(kind)             \
  case Type::k##kind:                         \
    rebuilt_ty.reset(type.Clone().release()); \
    return type_pool_.insert(std::move(rebuilt_ty)).first->get()

    DefineNoSubtypeCase(Void);
    DefineNoSubtypeCase(Bool);
    DefineNoSubtypeCase(Integer);
    DefineNoSubtypeCase(Float);
    DefineNoSubtypeCase(Sampler);
    DefineNoSubtypeCase(Opaque);
    DefineNoSubtypeCase(Event);
    DefineNoSubtypeCase(DeviceEvent);
    DefineNoSubtypeCase(ReserveId);
    DefineNoSubtypeCase(Queue);
    DefineNoSubtypeCase(Pipe);
    DefineNoSubtypeCase(PipeStorage);
    DefineNoSubtypeCase(NamedBarrier);
    DefineNoSubtypeCase(AccelerationStructureNV);
    DefineNoSubtypeCase(RayQueryKHR);
    DefineNoSubtypeCase(HitObjectNV);
#undef DefineNoSubtypeCase
    case Type::kVector: {
      const Vector* vec_ty = type.AsVector();
      const Type* ele_ty = vec_ty->element_type();
      rebuilt_ty = MakeUnique<Vector>(RebuildType(GetId(ele_ty), *ele_ty),
                                      vec_ty->element_count());
      break;
    }
    case Type::kMatrix: {
      const Matrix* mat_ty = type.AsMatrix();
      const Type* ele_ty = mat_ty->element_type();
      rebuilt_ty = MakeUnique<Matrix>(RebuildType(GetId(ele_ty), *ele_ty),
                                      mat_ty->element_count());
      break;
    }
    case Type::kImage: {
      const Image* image_ty = type.AsImage();
      const Type* ele_ty = image_ty->sampled_type();
      rebuilt_ty = MakeUnique<Image>(
          RebuildType(GetId(ele_ty), *ele_ty), image_ty->dim(),
          image_ty->depth(), image_ty->is_arrayed(),
          image_ty->is_multisampled(), image_ty->sampled(), image_ty->format(),
          image_ty->access_qualifier());
      break;
    }
    case Type::kSampledImage: {
      const SampledImage* image_ty = type.AsSampledImage();
      const Type* ele_ty = image_ty->image_type();
      rebuilt_ty =
          MakeUnique<SampledImage>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kArray: {
      const Array* array_ty = type.AsArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty = MakeUnique<Array>(RebuildType(GetId(ele_ty), *ele_ty),
                                     array_ty->length_info());
      break;
    }
    case Type::kRuntimeArray: {
      const RuntimeArray* array_ty = type.AsRuntimeArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty =
          MakeUnique<RuntimeArray>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kStruct: {
      const Struct* struct_ty = type.AsStruct();
      std::vector<const Type*> subtypes;
      subtypes.reserve(struct_ty->element_types().size());
      for (const auto* ele_ty : struct_ty->element_types()) {
        subtypes.push_back(RebuildType(GetId(ele_ty), *ele_ty));
      }
      rebuilt_ty = MakeUnique<Struct>(subtypes);
      Struct* rebuilt_struct = rebuilt_ty->AsStruct();
      for (auto pair : struct_ty->element_decorations()) {
        uint32_t index = pair.first;
        for (const auto& dec : pair.second) {
          // Explicit copy intended.
          std::vector<uint32_t> copy(dec);
          rebuilt_struct->AddMemberDecoration(index, std::move(copy));
        }
      }
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer_ty = type.AsPointer();
      const Type* ele_ty = pointer_ty->pointee_type();
      rebuilt_ty = MakeUnique<Pointer>(RebuildType(GetId(ele_ty), *ele_ty),
                                       pointer_ty->storage_class());
      break;
    }
    case Type::kFunction: {
      const Function* function_ty = type.AsFunction();
      const Type* ret_ty = function_ty->return_type();
      std::vector<const Type*> param_types;
      param_types.reserve(function_ty->param_types().size());
      for (const auto* param_ty : function_ty->param_types()) {
        param_types.push_back(RebuildType(GetId(param_ty), *param_ty));
      }
      rebuilt_ty = MakeUnique<Function>(RebuildType(GetId(ret_ty), *ret_ty),
                                        param_types);
      break;
    }
    case Type::kForwardPointer: {
      const ForwardPointer* forward_ptr_ty = type.AsForwardPointer();
      rebuilt_ty = MakeUnique<ForwardPointer>(forward_ptr_ty->target_id(),
                                              forward_ptr_ty->storage_class());
      const Pointer* target_ptr = forward_ptr_ty->target_pointer();
      if (target_ptr) {
        rebuilt_ty->AsForwardPointer()->SetTargetPointer(
            RebuildType(GetId(target_ptr), *target_ptr)->AsPointer());
      }
      break;
    }
    case Type::kCooperativeMatrixNV: {
      const CooperativeMatrixNV* cm_type = type.AsCooperativeMatrixNV();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixNV>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id());
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      const CooperativeMatrixKHR* cm_type = type.AsCooperativeMatrixKHR();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixKHR>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id(),
          cm_type->use_id());
      break;
    }
    default:
      assert(false && "Unhandled type");
      return nullptr;
  }
  for (const auto& dec : type.decorations()) {
    // Explicit copy intended.
    std::vector<uint32_t> copy(dec);
    rebuilt_ty->AddDecoration(std::move(copy));
  }

  return type_pool_.insert(std::move(rebuilt_ty)).first->get();
}